

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall CConnman::InactivityCheck(CConnman *this,CNode *node)

{
  long lVar1;
  long lVar2;
  string_view source_file;
  char cVar3;
  bool bVar4;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar5;
  Logger *pLVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  long in_FS_OFFSET;
  string_view str;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  long *in_stack_fffffffffffffef8;
  long *in_stack_ffffffffffffff00;
  bool local_f2;
  undefined1 local_f1;
  rep local_f0 [2];
  string log_msg;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  tVar5 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  lVar1 = (node->m_last_send)._M_i.__r;
  lVar2 = (node->m_last_recv)._M_i.__r;
  if ((this->m_peer_connect_timeout).__r + (node->m_connected).__r < (long)tVar5.__d.__r) {
    if (lVar1 == 0 || lVar2 == 0) {
      bVar4 = ::LogAcceptCategory(NET,Debug);
      bVar7 = true;
      if (bVar4) {
        local_f0[0] = (this->m_peer_connect_timeout).__r;
        local_f1 = lVar2 != 0;
        local_f2 = lVar1 != 0;
        pLVar6 = LogInstance();
        bVar4 = BCLog::Logger::Enabled(pLVar6);
        if (bVar4) {
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          log_msg._M_string_length = 0;
          log_msg.field_2._M_local_buf[0] = '\0';
          tinyformat::format<long,bool,bool,long>
                    (&local_58,
                     (tinyformat *)"socket no message in first %i seconds, %d %d peer=%d\n",
                     (char *)local_f0,(long *)&local_f1,&local_f2,(bool *)&stack0xffffffffffffff00,
                     in_stack_fffffffffffffef8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&log_msg,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          pLVar6 = LogInstance();
          local_58._M_dataplus._M_p = &DAT_00000050;
          local_58._M_string_length = 0xcad8a1;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file._M_len = 0x50;
          str._M_str = log_msg._M_dataplus._M_p;
          str._M_len = log_msg._M_string_length;
          logging_function_01._M_str = "InactivityCheck";
          logging_function_01._M_len = 0xf;
          BCLog::Logger::LogPrintStr(pLVar6,str,logging_function_01,source_file,0x7b1,NET,Debug);
          std::__cxx11::string::~string((string *)&log_msg);
        }
      }
      goto LAB_00711f09;
    }
    if (lVar1 + 0x4b0 < (long)tVar5.__d.__r) {
      bVar4 = ::LogAcceptCategory(NET,Debug);
      bVar7 = true;
      if (!bVar4) goto LAB_00711f09;
      local_58._M_dataplus._M_p = (pointer)node->id;
      pcVar9 = "socket sending timeout: %is peer=%d\n";
      iVar8 = 0x7b6;
      lVar2 = lVar1;
    }
    else {
      if ((long)tVar5.__d.__r <= lVar2 + 0x4b0) {
        if (((node->fSuccessfullyConnected)._M_base._M_i & 1U) == 0) {
          (*((node->m_transport)._M_t.
             super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
             super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
             super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[2])(&log_msg);
          cVar3 = (char)log_msg._M_dataplus._M_p;
          bVar4 = ::LogAcceptCategory(NET,Debug);
          if (cVar3 == '\0') {
            bVar7 = true;
            if (!bVar4) goto LAB_00711f09;
            log_msg._M_dataplus._M_p = (pointer)node->id;
            pcVar9 = "V2 handshake timeout peer=%d\n";
            iVar8 = 0x7c1;
          }
          else {
            bVar7 = true;
            if (!bVar4) goto LAB_00711f09;
            log_msg._M_dataplus._M_p = (pointer)node->id;
            pcVar9 = "version handshake timeout peer=%d\n";
            iVar8 = 0x7c3;
          }
          bVar7 = true;
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
          source_file_01._M_len = 0x50;
          logging_function_00._M_str = "InactivityCheck";
          logging_function_00._M_len = 0xf;
          LogPrintf_<long>(logging_function_00,source_file_01,iVar8,NET,Debug,pcVar9,
                           (long *)&log_msg);
          goto LAB_00711f09;
        }
        goto LAB_00711f07;
      }
      bVar4 = ::LogAcceptCategory(NET,Debug);
      bVar7 = true;
      if (!bVar4) goto LAB_00711f09;
      local_58._M_dataplus._M_p = (pointer)node->id;
      pcVar9 = "socket receive timeout: %is peer=%d\n";
      iVar8 = 0x7bb;
    }
    log_msg._M_dataplus._M_p = (pointer)((long)tVar5.__d.__r - lVar2);
    bVar7 = true;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
    source_file_00._M_len = 0x50;
    logging_function._M_str = "InactivityCheck";
    logging_function._M_len = 0xf;
    LogPrintf_<long,long>
              (logging_function,source_file_00,iVar8,(LogFlags)pcVar9,(Level)&log_msg,
               (char *)&local_58,in_stack_fffffffffffffef8,in_stack_ffffffffffffff00);
  }
  else {
LAB_00711f07:
    bVar7 = false;
  }
LAB_00711f09:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::InactivityCheck(const CNode& node) const
{
    // Tests that see disconnects after using mocktime can start nodes with a
    // large timeout. For example, -peertimeout=999999999.
    const auto now{GetTime<std::chrono::seconds>()};
    const auto last_send{node.m_last_send.load()};
    const auto last_recv{node.m_last_recv.load()};

    if (!ShouldRunInactivityChecks(node, now)) return false;

    if (last_recv.count() == 0 || last_send.count() == 0) {
        LogDebug(BCLog::NET, "socket no message in first %i seconds, %d %d peer=%d\n", count_seconds(m_peer_connect_timeout), last_recv.count() != 0, last_send.count() != 0, node.GetId());
        return true;
    }

    if (now > last_send + TIMEOUT_INTERVAL) {
        LogDebug(BCLog::NET, "socket sending timeout: %is peer=%d\n", count_seconds(now - last_send), node.GetId());
        return true;
    }

    if (now > last_recv + TIMEOUT_INTERVAL) {
        LogDebug(BCLog::NET, "socket receive timeout: %is peer=%d\n", count_seconds(now - last_recv), node.GetId());
        return true;
    }

    if (!node.fSuccessfullyConnected) {
        if (node.m_transport->GetInfo().transport_type == TransportProtocolType::DETECTING) {
            LogDebug(BCLog::NET, "V2 handshake timeout peer=%d\n", node.GetId());
        } else {
            LogDebug(BCLog::NET, "version handshake timeout peer=%d\n", node.GetId());
        }
        return true;
    }

    return false;
}